

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_ldrddi.cpp
# Opt level: O0

ze_result_t loader::zesPerformanceFactorSetConfig(zes_perf_handle_t hPerf,double factor)

{
  zes_pfnPerformanceFactorSetConfig_t pfnSetConfig;
  dditable_t *dditable;
  ze_result_t result;
  double factor_local;
  zes_perf_handle_t hPerf_local;
  
  if (*(code **)(*(long *)(hPerf + 8) + 0xa90) == (code *)0x0) {
    hPerf_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    hPerf_local._4_4_ = (**(code **)(*(long *)(hPerf + 8) + 0xa90))(factor,*(undefined8 *)hPerf);
  }
  return hPerf_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesPerformanceFactorSetConfig(
        zes_perf_handle_t hPerf,                        ///< [in] Handle for the Performance Factor domain.
        double factor                                   ///< [in] The new Performance Factor.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<zes_perf_object_t*>( hPerf )->dditable;
        auto pfnSetConfig = dditable->zes.PerformanceFactor.pfnSetConfig;
        if( nullptr == pfnSetConfig )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hPerf = reinterpret_cast<zes_perf_object_t*>( hPerf )->handle;

        // forward to device-driver
        result = pfnSetConfig( hPerf, factor );

        return result;
    }